

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void SpiritKarma(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  undefined1 local_1460 [8];
  random_device _rdev;
  char buf [64];
  param_type local_90;
  uniform_int_distribution<int> _dist;
  char *beg;
  result_type i;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"spirit karma",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  std::random_device::random_device((random_device *)local_1460);
  local_90._M_a = -0x80000000;
  local_90._M_b = 0x7fffffff;
  iVar5 = 10000000;
  lVar2 = std::chrono::_V2::steady_clock::now();
  do {
    beg._4_4_ = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_90,(random_device *)local_1460,
                           &local_90);
    _dist._M_param._M_a = 0;
    _dist._M_param._M_b = 0;
    boost::spirit::karma::
    any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>::
    insert_int<boost::spirit::karma::detail::output_iterator<char*,mpl_::int_<15>,boost::spirit::unused_type>,int>
              ((output_iterator<char_*,_mpl_::int_<15>,_boost::spirit::unused_type> *)&_dist,
               (int *)((long)&beg + 4));
    _rdev.field_0.field2[0x1380] = 0;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  lVar3 = std::chrono::_V2::steady_clock::now();
  std::random_device::_M_fini();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    RANDOM_PROFILING_BEGIN("spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    RANDOM_PROFILING_END()
}